

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

error_code __thiscall
anon_unknown.dwarf_25e512::_remove_all_r
          (anon_unknown_dwarf_25e512 *this,StringRef path,file_type ft,uint32_t *count)

{
  bool bVar1;
  file_type fVar2;
  int iVar3;
  directory_entry *pdVar4;
  string *Str;
  undefined4 in_register_0000000c;
  int *piVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  StringRef path_00;
  error_code eVar6;
  Twine local_148;
  Twine local_130;
  anon_unknown_dwarf_25e512 *local_118;
  undefined8 local_110;
  Twine local_108;
  undefined1 local_f0 [8];
  file_status st;
  directory_iterator e;
  Twine local_88;
  undefined1 local_70 [8];
  directory_iterator i;
  error_code ec;
  uint32_t *count_local;
  undefined1 auStack_38 [4];
  file_type ft_local;
  StringRef path_local;
  error_code ec_1;
  
  piVar5 = (int *)CONCAT44(in_register_0000000c,ft);
  path_local.Data = path.Data;
  _auStack_38 = this;
  if ((int)path.Length == 3) {
    std::error_code::error_code((error_code *)&i.FollowSymlinks);
    llvm::Twine::Twine(&local_88,(StringRef *)auStack_38);
    llvm::sys::fs::directory_iterator::directory_iterator
              ((directory_iterator *)local_70,&local_88,(error_code *)&i.FollowSymlinks,false);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&i.FollowSymlinks);
    if (bVar1) {
      path_local.Length = i._16_8_;
      ec_1._0_8_ = ec._0_8_;
      e._20_4_ = 1;
    }
    else {
      llvm::sys::fs::directory_iterator::directory_iterator((directory_iterator *)&st.fs_st_ino);
      while (bVar1 = llvm::sys::fs::directory_iterator::operator!=
                               ((directory_iterator *)local_70,(directory_iterator *)&st.fs_st_ino),
            bVar1) {
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)&i.FollowSymlinks);
        if (bVar1) {
          path_local.Length = i._16_8_;
          ec_1._0_8_ = ec._0_8_;
          e._20_4_ = 1;
          goto LAB_002182bf;
        }
        llvm::sys::fs::file_status::file_status((file_status *)local_f0);
        pdVar4 = llvm::sys::fs::directory_iterator::operator->((directory_iterator *)local_70);
        Str = llvm::sys::fs::directory_entry::path_abi_cxx11_(pdVar4);
        llvm::Twine::Twine(&local_108,Str);
        eVar6 = link_status(&local_108,(file_status *)local_f0);
        ec_1._0_8_ = eVar6._M_cat;
        path_local.Length = CONCAT44(path_local.Length._4_4_,eVar6._M_value);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local.Length);
        if (bVar1) {
          e._20_4_ = 1;
          goto LAB_002182bf;
        }
        pdVar4 = llvm::sys::fs::directory_iterator::operator->((directory_iterator *)local_70);
        llvm::sys::fs::directory_entry::path_abi_cxx11_(pdVar4);
        local_118 = (anon_unknown_dwarf_25e512 *)std::__cxx11::string::data();
        local_110 = std::__cxx11::string::length();
        fVar2 = llvm::sys::fs::basic_file_status::type((basic_file_status *)local_f0);
        path_00.Length._0_4_ = fVar2;
        path_00.Data = (char *)local_110;
        path_00.Length._4_4_ = 0;
        eVar6 = _remove_all_r(local_118,path_00,ft,count);
        ec_1._0_8_ = eVar6._M_cat;
        path_local.Length = CONCAT44(path_local.Length._4_4_,eVar6._M_value);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local.Length);
        if (bVar1) {
          e._20_4_ = 1;
          goto LAB_002182bf;
        }
        llvm::sys::fs::directory_iterator::increment
                  ((directory_iterator *)local_70,(error_code *)&i.FollowSymlinks);
      }
      e._20_4_ = 2;
LAB_002182bf:
      llvm::sys::fs::directory_iterator::~directory_iterator((directory_iterator *)&st.fs_st_ino);
      if (e._20_4_ == 2) {
        llvm::Twine::Twine(&local_130,(StringRef *)auStack_38);
        iVar3 = llvm::sys::fs::remove((fs *)&local_130,(char *)0x0);
        path_local.Length = CONCAT44(path_local.Length._4_4_,iVar3);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local.Length);
        ec_1._0_8_ = extraout_RDX;
        if (bVar1) {
          e._20_4_ = 1;
        }
        else {
          *piVar5 = *piVar5 + 1;
          e._20_4_ = 0;
        }
      }
    }
    llvm::sys::fs::directory_iterator::~directory_iterator((directory_iterator *)local_70);
    if (e._20_4_ != 0) goto LAB_00218390;
  }
  else {
    llvm::Twine::Twine(&local_148,(StringRef *)auStack_38);
    iVar3 = llvm::sys::fs::remove((fs *)&local_148,(char *)0x0);
    path_local.Length = CONCAT44(path_local.Length._4_4_,iVar3);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local.Length);
    ec_1._0_8_ = extraout_RDX_00;
    if (bVar1) goto LAB_00218390;
    *piVar5 = *piVar5 + 1;
  }
  std::error_code::error_code((error_code *)&path_local.Length);
LAB_00218390:
  eVar6._0_8_ = path_local.Length & 0xffffffff;
  eVar6._M_cat = (error_category *)ec_1._0_8_;
  return eVar6;
}

Assistant:

error_code _remove_all_r(StringRef path, file_type ft, uint32_t &count) {
    if (ft == file_type::directory_file) {
      error_code ec;
      // For removal purposes, we should not follow through symlinks. Rather,
      // we just want to remove the symlink itself.
      directory_iterator i(path, ec, /* FollowSymlinks */ false);
      if (ec)
        return ec;

      for (directory_iterator e; i != e; i.increment(ec)) {
        if (ec)
          return ec;

        file_status st;

        if (error_code ec = link_status(i->path(), st))
          return ec;

        if (error_code ec = _remove_all_r(i->path(), st.type(), count))
          return ec;
      }

      if (error_code ec = remove(path, false))
        return ec;

      ++count; // Include the directory itself in the items removed.
    } else {
      if (error_code ec = remove(path, false))
        return ec;

      ++count;
    }

    return error_code();
  }